

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

void __thiscall
mkvmuxer::Segment::MoveCuesBeforeClustersHelper
          (Segment *this,uint64_t diff,int32_t index,uint64_t *cues_size)

{
  CuePoint **ppCVar1;
  int32 iVar2;
  int32 iVar3;
  uint64_t uVar4;
  uint64 uVar5;
  uint64_t value;
  uint64 uVar6;
  int32_t i;
  int index_00;
  CuePoint *this_00;
  long lVar7;
  
  ppCVar1 = (this->cues_).cue_entries_;
  this_00 = (CuePoint *)0x0;
  if ((ppCVar1 != (CuePoint **)0x0) && (index < (this->cues_).cue_entries_size_)) {
    this_00 = ppCVar1[index];
  }
  if (this_00 != (CuePoint *)0x0) {
    uVar4 = CuePoint::PayloadSize(this_00);
    uVar5 = EbmlMasterElementSize(0xbb,uVar4);
    this_00->cluster_pos_ = this_00->cluster_pos_ + diff;
    value = CuePoint::PayloadSize(this_00);
    uVar6 = EbmlMasterElementSize(0xbb,value);
    lVar7 = (value - (uVar5 + uVar4)) + uVar6;
    iVar2 = GetCodedUIntSize(*cues_size + lVar7);
    iVar3 = GetCodedUIntSize(*cues_size);
    *cues_size = *cues_size + lVar7;
    uVar4 = (iVar2 - iVar3) + lVar7;
    if ((uVar4 != 0) && (0 < (this->cues_).cue_entries_size_)) {
      index_00 = 0;
      do {
        MoveCuesBeforeClustersHelper(this,uVar4,index_00,cues_size);
        index_00 = index_00 + 1;
      } while (index_00 < (this->cues_).cue_entries_size_);
    }
  }
  return;
}

Assistant:

void Segment::MoveCuesBeforeClustersHelper(uint64_t diff, int32_t index,
                                           uint64_t* cues_size) {
  CuePoint* const cue_point = cues_.GetCueByIndex(index);
  if (cue_point == NULL)
    return;
  const uint64_t old_cue_point_size = cue_point->Size();
  const uint64_t cluster_pos = cue_point->cluster_pos() + diff;
  cue_point->set_cluster_pos(cluster_pos);  // update the new cluster position
  // New size of the cue is computed as follows
  //    Let a = current sum of size of all CuePoints
  //    Let b = Increase in Cue Point's size due to this iteration
  //    Let c = Increase in size of Cues Element's length due to this iteration
  //            (This is computed as CodedSize(a + b) - CodedSize(a))
  //    Let d = b + c. Now d is the |diff| passed to the next recursive call.
  //    Let e = a + b. Now e is the |cues_size| passed to the next recursive
  //                   call.
  const uint64_t cue_point_size_diff = cue_point->Size() - old_cue_point_size;
  const uint64_t cue_size_diff =
      GetCodedUIntSize(*cues_size + cue_point_size_diff) -
      GetCodedUIntSize(*cues_size);
  *cues_size += cue_point_size_diff;
  diff = cue_size_diff + cue_point_size_diff;
  if (diff > 0) {
    for (int32_t i = 0; i < cues_.cue_entries_size(); ++i) {
      MoveCuesBeforeClustersHelper(diff, i, cues_size);
    }
  }
}